

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

ssize_t readn(int fd,string *inBuffer,bool *zero)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t sVar3;
  allocator<char> local_1059;
  string local_1058 [32];
  char local_1038 [8];
  char buff [4096];
  ssize_t readSum;
  ssize_t nread;
  bool *zero_local;
  string *inBuffer_local;
  undefined1 uStack_10;
  undefined1 uStack_f;
  undefined1 uStack_e;
  undefined1 uStack_d;
  int fd_local;
  
  buff[0xff8] = '\0';
  buff[0xff9] = '\0';
  buff[0xffa] = '\0';
  buff[0xffb] = '\0';
  buff[0xffc] = '\0';
  buff[0xffd] = '\0';
  buff[0xffe] = '\0';
  buff[0xfff] = '\0';
  while( true ) {
    while (sVar1 = read(fd,local_1038,0x1000), sVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        piVar2 = __errno_location();
        if (*piVar2 == 0xb) {
          uStack_10 = buff[0xff8];
          uStack_f = buff[0xff9];
          uStack_e = buff[0xffa];
          uStack_d = buff[0xffb];
          fd_local._0_1_ = buff[0xffc];
          fd_local._1_1_ = buff[0xffd];
          fd_local._2_1_ = buff[0xffe];
          fd_local._3_1_ = buff[0xfff];
        }
        else {
          perror("read error");
          _uStack_10 = -1;
        }
        return _uStack_10;
      }
    }
    if (sVar1 == 0) break;
    buff._4088_8_ = buff._4088_8_ + sVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char*,void>(local_1058,local_1038,local_1038 + sVar1,&local_1059);
    std::__cxx11::string::operator+=((string *)inBuffer,local_1058);
    std::__cxx11::string::~string(local_1058);
    std::allocator<char>::~allocator(&local_1059);
  }
  *zero = true;
  sVar3._0_1_ = buff[0xff8];
  sVar3._1_1_ = buff[0xff9];
  sVar3._2_1_ = buff[0xffa];
  sVar3._3_1_ = buff[0xffb];
  sVar3._4_1_ = buff[0xffc];
  sVar3._5_1_ = buff[0xffd];
  sVar3._6_1_ = buff[0xffe];
  sVar3._7_1_ = buff[0xfff];
  return sVar3;
}

Assistant:

ssize_t readn(int fd, std::string &inBuffer, bool &zero) {
  ssize_t nread = 0;
  ssize_t readSum = 0;
  while (true) {
    char buff[MAX_BUFF];
    if ((nread = read(fd, buff, MAX_BUFF)) < 0) {
      if (errno == EINTR)
        continue;
      else if (errno == EAGAIN) {
        return readSum;
      } else {
        perror("read error");
        return -1;
      }
    } else if (nread == 0) {
      // printf("redsum = %d\n", readSum);
      zero = true;
      break;
    }
    // printf("before inBuffer.size() = %d\n", inBuffer.size());
    // printf("nread = %d\n", nread);
    readSum += nread;
    // buff += nread;
    inBuffer += std::string(buff, buff + nread);
    // printf("after inBuffer.size() = %d\n", inBuffer.size());
  }
  return readSum;
}